

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GuidedMeshNormalFiltering.cpp
# Opt level: O1

double __thiscall
GuidedMeshNormalFiltering::getSigmaS
          (GuidedMeshNormalFiltering *this,double multiple,
          vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
          *centroid,TriMesh *mesh)

{
  double dVar1;
  double dVar2;
  pointer pVVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  FaceIter FVar7;
  GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::FaceHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toOppositeFaceHandle>
  local_a0;
  undefined1 local_88 [8];
  FaceFaceIter ff_it;
  undefined1 local_50 [8];
  FaceIter f_it;
  double local_38;
  
  _local_50 = OpenMesh::PolyConnectivity::faces_begin((PolyConnectivity *)mesh);
  FVar7 = OpenMesh::PolyConnectivity::faces_end((PolyConnectivity *)mesh);
  f_it.hnd_.super_BaseHandle.idx_ = (BaseHandle)0x0;
  f_it.skip_bits_ = 0;
  local_38 = 0.0;
  if ((BaseHandle)f_it.mesh_._0_4_ != FVar7.hnd_.super_BaseHandle.idx_.super_BaseHandle ||
      local_50 != (undefined1  [8])FVar7.mesh_) {
    local_38 = 0.0;
    f_it.hnd_.super_BaseHandle.idx_ = (BaseHandle)0x0;
    f_it.skip_bits_ = 0;
    do {
      pVVar3 = (centroid->
               super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      ff_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>._16_8_ =
           pVVar3[f_it.mesh_._0_4_].super_VectorDataT<double,_3>.values_[0];
      dVar1 = pVVar3[f_it.mesh_._0_4_].super_VectorDataT<double,_3>.values_[1];
      dVar2 = pVVar3[f_it.mesh_._0_4_].super_VectorDataT<double,_3>.values_[2];
      OpenMesh::Iterators::
      GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::FaceHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toOppositeFaceHandle>
      ::GenericCirculatorT
                ((GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::FaceHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toOppositeFaceHandle>
                  *)local_88,(mesh_ref)mesh,(FaceHandle)f_it.mesh_._0_4_,false);
      while ((ff_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.mesh_._4_4_ != -1 &&
             (((int)ff_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.mesh_ !=
               ff_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.mesh_._4_4_ ||
              (ff_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.start_.
               super_BaseHandle.idx_ == 0))))) {
        ff_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.heh_.super_BaseHandle.idx_ =
             (BaseHandle)
             OpenMesh::Iterators::
             GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::FaceHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toOppositeFaceHandle>
             ::operator*((GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::FaceHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toOppositeFaceHandle>
                          *)local_88);
        pVVar3 = (centroid->
                 super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        dVar5 = pVVar3[(int)ff_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.heh_.
                            super_BaseHandle.idx_].super_VectorDataT<double,_3>.values_[0] -
                (double)ff_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>._16_8_;
        dVar6 = pVVar3[(int)ff_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.heh_.
                            super_BaseHandle.idx_].super_VectorDataT<double,_3>.values_[1] - dVar1;
        dVar4 = pVVar3[(int)ff_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.heh_.
                            super_BaseHandle.idx_].super_VectorDataT<double,_3>.values_[2] - dVar2;
        dVar4 = dVar4 * dVar4 + dVar5 * dVar5 + dVar6 * dVar6;
        if (dVar4 < 0.0) {
          dVar4 = sqrt(dVar4);
        }
        else {
          dVar4 = SQRT(dVar4);
        }
        local_38 = local_38 + dVar4;
        f_it._8_8_ = (double)f_it._8_8_ + 1.0;
        OpenMesh::Iterators::
        GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::FaceHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toOppositeFaceHandle>
        ::operator++(&local_a0,
                     (GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::FaceHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toOppositeFaceHandle>
                      *)local_88,0);
      }
      f_it.mesh_._0_4_ = f_it.mesh_._0_4_ + 1;
      if (f_it.mesh_._4_4_ != 0) {
        OpenMesh::Iterators::
        GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_face_status,_&OpenMesh::ArrayKernel::n_faces>
        ::skip_fwd((GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_face_status,_&OpenMesh::ArrayKernel::n_faces>
                    *)local_50);
      }
      FVar7 = OpenMesh::PolyConnectivity::faces_end((PolyConnectivity *)mesh);
    } while ((BaseHandle)f_it.mesh_._0_4_ != FVar7.hnd_.super_BaseHandle.idx_.super_BaseHandle ||
             local_50 != (undefined1  [8])FVar7.mesh_);
  }
  return (local_38 * multiple) / (double)f_it._8_8_;
}

Assistant:

double GuidedMeshNormalFiltering::getSigmaS(double multiple, std::vector<TriMesh::Point> &centroid, TriMesh &mesh)
{
    double sigma_s = 0.0, num = 0.0;
    for(TriMesh::FaceIter f_it = mesh.faces_begin(); f_it != mesh.faces_end(); f_it++)
    {
        TriMesh::Point fi = centroid[f_it->idx()];
        for(TriMesh::FaceFaceIter ff_it = mesh.ff_iter(*f_it); ff_it.is_valid(); ff_it++)
        {
            TriMesh::Point fj = centroid[ff_it->idx()];
            sigma_s += (fj - fi).length();
            num++;
        }
    }
    return sigma_s * multiple / num;
}